

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::anon_unknown_0::Stack::newCall
          (Stack *this,LocationRange *loc,HeapEntity *context,HeapObject *self,uint offset,
          BindingFrame *up_values)

{
  uint uVar1;
  pointer __first;
  LocationRange *pLVar2;
  long lVar3;
  pointer __result;
  pointer pFVar4;
  _Base_ptr p_Var5;
  ostream *poVar6;
  RuntimeError *__return_storage_ptr__;
  pointer pFVar7;
  char *__s;
  Frame *__last;
  size_t __n;
  ulong uVar8;
  allocator<char> local_81;
  LocationRange *local_80;
  uint local_74;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  *local_70;
  string local_68;
  pointer local_48;
  HeapEntity *local_40;
  HeapObject *local_38;
  
  pFVar7 = (this->stack).
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __last = (this->stack).
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __n = 400;
  lVar3 = ((long)__last - (long)pFVar7) / 400;
  __s = (char *)(((long)__last - (long)pFVar7) % 400);
  do {
    lVar3 = lVar3 + -1;
    local_74 = offset;
    local_40 = context;
    local_38 = self;
    if ((int)(uint)lVar3 < 0) goto LAB_0017e657;
    uVar8 = (ulong)((uint)lVar3 & 0x7fffffff);
    __s = (char *)(uVar8 * 400);
    uVar1 = *(uint *)(__s + (long)pFVar7);
    __n = (size_t)uVar1;
  } while (uVar1 == 0xd);
  if (((uVar1 == 6) && (__s = __s + (long)pFVar7, __s[0x50] == '\x01')) &&
     (pLVar2 = loc, *(long *)(__s + 0xf0) == *(long *)(__s + 0xe8))) {
    while (local_80 = pLVar2, __s = (char *)(((long)__last - (long)pFVar7) % 400),
          uVar8 < (ulong)(((long)__last - (long)pFVar7) / 400)) {
      std::
      vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
      ::pop_back(&this->stack);
      pFVar7 = (this->stack).
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar2 = local_80;
      __last = (this->stack).
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    this->calls = this->calls - 1;
    loc = local_80;
  }
LAB_0017e657:
  if (this->limit <= this->calls) {
    __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"max stack frames exceeded.",&local_81);
    makeError(__return_storage_ptr__,this,loc,&local_68);
    __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  local_68._M_dataplus._M_p._0_4_ = 6;
  if (__last == (this->stack).
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_70 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                *)std::
                  vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                  ::_M_check_len(&this->stack,__n,__s);
    __first = (this->stack).
              super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pFVar7 = (this->stack).
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_80 = loc;
    local_48 = pFVar7;
    __result = std::
               _Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ::_M_allocate(local_70,__n);
    Frame::Frame((Frame *)(((long)__last - (long)__first) + (long)__result),(FrameKind *)&local_68,
                 local_80);
    pFVar4 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ::_S_relocate(__first,__last,__result,(_Tp_alloc_type *)pFVar7);
    pFVar4 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ::_S_relocate(__last,local_48,pFVar4 + 1,(_Tp_alloc_type *)0x190);
    lVar3 = (long)(this->stack).
                  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
    std::
    _Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
    ::_M_deallocate((_Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                     *)__first,(pointer)(lVar3 / 400),lVar3 % 400);
    (this->stack).
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->stack).
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar4;
    (this->stack).
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)local_70;
  }
  else {
    Frame::Frame(__last,(FrameKind *)&local_68,loc);
    pFVar4 = (this->stack).
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->stack).
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar4;
  }
  this->calls = this->calls + 1;
  pFVar4[-1].context = local_40;
  (this->stack).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1].self = local_38;
  pFVar7 = (this->stack).
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar7[-1].offset = local_74;
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::operator=(&pFVar7[-1].bindings,up_values);
  (this->stack).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1].tailCall = false;
  p_Var5 = (up_values->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var5 == &(up_values->_M_t)._M_impl.super__Rb_tree_header) {
      return;
    }
    if (p_Var5[1]._M_parent == (_Base_ptr)0x0) break;
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: No binding for variable ");
  encode_utf8(&local_68,*(UString **)(p_Var5 + 1));
  poVar6 = std::operator<<(poVar6,(string *)&local_68);
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::~string((string *)&local_68);
  abort();
}

Assistant:

void newCall(const LocationRange &loc, HeapEntity *context, HeapObject *self, unsigned offset,
                 const BindingFrame &up_values)
    {
        tailCallTrimStack();
        if (calls >= limit) {
            throw makeError(loc, "max stack frames exceeded.");
        }
        stack.emplace_back(FRAME_CALL, loc);
        calls++;
        top().context = context;
        top().self = self;
        top().offset = offset;
        top().bindings = up_values;
        top().tailCall = false;

#ifndef NDEBUG
        for (const auto &bind : up_values) {
            if (bind.second == nullptr) {
                std::cerr << "INTERNAL ERROR: No binding for variable "
                          << encode_utf8(bind.first->name) << std::endl;
                std::abort();
            }
        }
#endif
    }